

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

longlong __thiscall mkvparser::Segment::ParseHeaders(Segment *this)

{
  long pos;
  int iVar1;
  IMkvReader *pIVar2;
  longlong lVar3;
  Tags *this_00;
  SegmentInfo *this_01;
  Chapters *this_02;
  Cues *pCVar4;
  SeekHead *this_03;
  Tracks *this_04;
  IMkvReader *pIVar5;
  IMkvReader *pIVar6;
  IMkvReader *pIVar7;
  long lVar8;
  IMkvReader *pIVar9;
  IMkvReader *pIVar10;
  IMkvReader *pIVar11;
  long len;
  longlong available;
  longlong total;
  long local_68;
  longlong local_60;
  long local_58;
  longlong local_50;
  long local_48;
  IMkvReader *local_40;
  ulong local_38;
  
  pIVar9 = this->m_pReader;
  iVar1 = (*pIVar9->_vptr_IMkvReader[1])(pIVar9,&local_38,&local_48);
  if (iVar1 < 0) {
    pIVar5 = (IMkvReader *)(long)iVar1;
  }
  else {
    pIVar7 = (IMkvReader *)0xfffffffffffffffe;
    pIVar5 = pIVar7;
    if (((long)local_38 < 1) || (local_48 <= (long)local_38)) {
      pIVar11 = (IMkvReader *)0xffffffffffffffff;
      if (-1 < this->m_size) {
        pIVar11 = (IMkvReader *)(this->m_start + this->m_size);
      }
      if (((long)pIVar11 <= (long)local_38 || (long)((ulong)pIVar11 | local_38) < 0) &&
         (((long)pIVar11 < 0 || (this->m_pos <= (long)pIVar11)))) {
        do {
          pos = this->m_pos;
          if ((-1 < (long)local_38 && (long)local_38 <= pos) ||
             (-1 < (long)pIVar11 && (long)pIVar11 <= pos)) goto LAB_0010ff78;
          pIVar10 = (IMkvReader *)(pos + 1);
          iVar1 = 1;
          if ((long)pIVar10 < 0) {
            pIVar5 = (IMkvReader *)0xfffffffffffffffe;
            iVar1 = 1;
          }
          else {
            pIVar5 = pIVar10;
            if ((long)pIVar10 <= local_48) {
              pIVar2 = (IMkvReader *)GetUIntLength(this->m_pReader,pos,&local_68);
              iVar1 = 1;
              pIVar5 = pIVar2;
              if ((((-1 < (long)pIVar2) && (pIVar5 = pIVar10, pIVar2 == (IMkvReader *)0x0)) &&
                  (((long)pIVar11 < 0 ||
                   (pIVar5 = (IMkvReader *)0xfffffffffffffffe, local_68 + pos <= (long)pIVar11))))
                 && (pIVar5 = (IMkvReader *)(local_68 + pos), local_68 + pos <= local_48)) {
                lVar3 = ReadID(this->m_pReader,pos,&local_68);
                pIVar10 = (IMkvReader *)0xfffffffffffffffe;
                pIVar5 = pIVar10;
                if (-1 < lVar3) {
                  if (lVar3 == 0x1f43b675) {
                    iVar1 = 2;
                    pIVar5 = pIVar9;
                  }
                  else {
                    pIVar5 = (IMkvReader *)(local_68 + pos + 1);
                    lVar8 = local_68 + pos;
                    if (lVar8 < local_48) {
                      local_60 = lVar3;
                      local_40 = pIVar5;
                      pIVar2 = (IMkvReader *)GetUIntLength(this->m_pReader,lVar8,&local_68);
                      pIVar5 = pIVar2;
                      if (((-1 < (long)pIVar2) && (pIVar5 = local_40, pIVar2 == (IMkvReader *)0x0))
                         && ((((long)pIVar11 < 0 ||
                              (pIVar5 = pIVar10, local_68 + lVar8 <= (long)pIVar11)) &&
                             ((pIVar5 = (IMkvReader *)(local_68 + lVar8),
                              local_68 + lVar8 <= local_48 &&
                              (pIVar2 = (IMkvReader *)ReadUInt(this->m_pReader,lVar8,&local_68),
                              pIVar5 = pIVar2,
                              0xfffffffffffffff7 < local_68 - 9U && -1 < (long)pIVar2)))))) {
                        lVar8 = local_68 + lVar8;
                        pIVar6 = (IMkvReader *)((long)&pIVar2->_vptr_IMkvReader + lVar8);
                        pIVar5 = pIVar10;
                        if ((-1 < (long)pIVar6) &&
                           ((local_50 = lVar8, pIVar6 <= pIVar11 &&
                            (pIVar5 = pIVar6, local_40 = pIVar6, (long)pIVar6 <= local_48)))) {
                          local_58 = (long)pIVar6 - pos;
                          if (local_60 < 0x1549a966) {
                            if (local_60 == 0x1043a770) {
                              if (this->m_pChapters == (Chapters *)0x0) {
                                this_02 = (Chapters *)operator_new(0x38,(nothrow_t *)&std::nothrow);
                                if (this_02 == (Chapters *)0x0) {
                                  this_02 = (Chapters *)0x0;
                                }
                                else {
                                  this_02->m_pSegment = this;
                                  this_02->m_start = local_50;
                                  this_02->m_size = (longlong)pIVar2;
                                  this_02->m_element_start = pos;
                                  this_02->m_element_size = local_58;
                                  this_02->m_editions = (Edition *)0x0;
                                  this_02->m_editions_size = 0;
                                  this_02->m_editions_count = 0;
                                }
                                this->m_pChapters = this_02;
                                if (this_02 == (Chapters *)0x0) goto LAB_0010ff52;
                                pIVar5 = (IMkvReader *)Chapters::Parse(this_02);
                                goto LAB_0010ff2d;
                              }
                            }
                            else if (local_60 == 0x114d9b74) {
                              if (this->m_pSeekHead == (SeekHead *)0x0) {
                                this_03 = (SeekHead *)operator_new(0x48,(nothrow_t *)&std::nothrow);
                                if (this_03 == (SeekHead *)0x0) {
                                  this_03 = (SeekHead *)0x0;
                                }
                                else {
                                  this_03->m_pSegment = this;
                                  this_03->m_start = local_50;
                                  this_03->m_size = (longlong)pIVar2;
                                  this_03->m_element_start = pos;
                                  this_03->m_element_size = local_58;
                                  this_03->m_entries = (Entry *)0x0;
                                  this_03->m_entry_count = 0;
                                  this_03->m_void_elements = (VoidElement *)0x0;
                                  this_03->m_void_element_count = 0;
                                }
                                this->m_pSeekHead = this_03;
                                if (this_03 == (SeekHead *)0x0) goto LAB_0010ff52;
                                pIVar5 = (IMkvReader *)SeekHead::Parse(this_03);
                                goto LAB_0010ff2d;
                              }
                            }
                            else if ((local_60 == 0x1254c367) && (this->m_pTags == (Tags *)0x0)) {
                              this_00 = (Tags *)operator_new(0x38,(nothrow_t *)&std::nothrow);
                              if (this_00 == (Tags *)0x0) {
                                this_00 = (Tags *)0x0;
                              }
                              else {
                                this_00->m_pSegment = this;
                                this_00->m_start = local_50;
                                this_00->m_size = (longlong)pIVar2;
                                this_00->m_element_start = pos;
                                this_00->m_element_size = local_58;
                                this_00->m_tags = (Tag *)0x0;
                                this_00->m_tags_size = 0;
                                this_00->m_tags_count = 0;
                              }
                              this->m_pTags = this_00;
                              if (this_00 == (Tags *)0x0) {
LAB_0010ff52:
                                pIVar5 = (IMkvReader *)0xffffffffffffffff;
                                goto LAB_0010fbd3;
                              }
                              pIVar5 = (IMkvReader *)Tags::Parse(this_00);
LAB_0010ff2d:
                              if (pIVar5 != (IMkvReader *)0x0) goto LAB_0010fbd3;
                            }
                          }
                          else {
                            if (local_60 != 0x1c53bb6b) {
                              if (local_60 == 0x1654ae6b) {
                                pIVar5 = pIVar10;
                                if (this->m_pTracks == (Tracks *)0x0) {
                                  this_04 = (Tracks *)operator_new(0x38,(nothrow_t *)&std::nothrow);
                                  if (this_04 == (Tracks *)0x0) {
                                    this_04 = (Tracks *)0x0;
                                  }
                                  else {
                                    this_04->m_pSegment = this;
                                    this_04->m_start = local_50;
                                    this_04->m_size = (longlong)pIVar2;
                                    this_04->m_element_start = pos;
                                    this_04->m_element_size = local_58;
                                    this_04->m_trackEntries = (Track **)0x0;
                                    this_04->m_trackEntriesEnd = (Track **)0x0;
                                  }
                                  this->m_pTracks = this_04;
                                  if (this_04 == (Tracks *)0x0) goto LAB_0010ff52;
                                  pIVar5 = (IMkvReader *)Tracks::Parse(this_04);
                                  goto LAB_0010ff2d;
                                }
                              }
                              else {
                                if (local_60 != 0x1549a966) goto LAB_0010ff42;
                                pIVar5 = pIVar10;
                                if (this->m_pInfo == (SegmentInfo *)0x0) {
                                  this_01 = (SegmentInfo *)
                                            operator_new(0x50,(nothrow_t *)&std::nothrow);
                                  if (this_01 == (SegmentInfo *)0x0) {
                                    this_01 = (SegmentInfo *)0x0;
                                  }
                                  else {
                                    this_01->m_pSegment = this;
                                    this_01->m_start = local_50;
                                    this_01->m_size = (longlong)pIVar2;
                                    this_01->m_element_start = pos;
                                    this_01->m_element_size = local_58;
                                    this_01->m_pMuxingAppAsUTF8 = (char *)0x0;
                                    this_01->m_pWritingAppAsUTF8 = (char *)0x0;
                                    this_01->m_pTitleAsUTF8 = (char *)0x0;
                                  }
                                  this->m_pInfo = this_01;
                                  if (this_01 == (SegmentInfo *)0x0) goto LAB_0010ff52;
                                  pIVar5 = (IMkvReader *)SegmentInfo::Parse(this_01);
                                  goto LAB_0010ff2d;
                                }
                              }
                              goto LAB_0010fbd3;
                            }
                            if (this->m_pCues == (Cues *)0x0) {
                              pCVar4 = (Cues *)operator_new(0x48,(nothrow_t *)&std::nothrow);
                              if (pCVar4 == (Cues *)0x0) {
                                pCVar4 = (Cues *)0x0;
                              }
                              else {
                                pCVar4->m_pSegment = this;
                                pCVar4->m_start = local_50;
                                pCVar4->m_size = (longlong)pIVar2;
                                pCVar4->m_element_start = pos;
                                pCVar4->m_element_size = local_58;
                                pCVar4->m_cue_points = (CuePoint **)0x0;
                                pCVar4->m_count = 0;
                                pCVar4->m_preload_count = 0;
                                pCVar4->m_pos = local_50;
                              }
                              this->m_pCues = pCVar4;
                              if (pCVar4 == (Cues *)0x0) goto LAB_0010ff52;
                            }
                          }
LAB_0010ff42:
                          this->m_pos = (longlong)local_40;
                          iVar1 = 0;
                          pIVar5 = pIVar9;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
LAB_0010fbd3:
          pIVar9 = pIVar5;
        } while (iVar1 == 0);
        if (iVar1 == 2) {
LAB_0010ff78:
          pIVar5 = pIVar7;
          if (((long)pIVar11 < 0 || this->m_pos <= (long)pIVar11) &&
             (this->m_pInfo != (SegmentInfo *)0x0)) {
            pIVar5 = (IMkvReader *)((ulong)(this->m_pTracks != (Tracks *)0x0) * 2 - 2);
          }
        }
      }
    }
  }
  return (longlong)pIVar5;
}

Assistant:

long long Segment::ParseHeaders() {
  // Outermost (level 0) segment object has been constructed,
  // and pos designates start of payload.  We need to find the
  // inner (level 1) elements.
  long long total, available;

  const int status = m_pReader->Length(&total, &available);

  if (status < 0)  // error
    return status;

  if (total > 0 && available > total)
    return E_FILE_FORMAT_INVALID;

  const long long segment_stop = (m_size < 0) ? -1 : m_start + m_size;

  if ((segment_stop >= 0 && total >= 0 && segment_stop > total) ||
      (segment_stop >= 0 && m_pos > segment_stop)) {
    return E_FILE_FORMAT_INVALID;
  }

  for (;;) {
    if ((total >= 0) && (m_pos >= total))
      break;

    if ((segment_stop >= 0) && (m_pos >= segment_stop))
      break;

    long long pos = m_pos;
    const long long element_start = pos;

    // Avoid rolling over pos when very close to LLONG_MAX.
    unsigned long long rollover_check = pos + 1ULL;
    if (rollover_check > LLONG_MAX)
      return E_FILE_FORMAT_INVALID;

    if ((pos + 1) > available)
      return (pos + 1);

    long len;
    long long result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return result;

    if (result > 0) {
      // MkvReader doesn't have enough data to satisfy this read attempt.
      return (pos + 1);
    }

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > available)
      return pos + len;

    const long long idpos = pos;
    const long long id = ReadID(m_pReader, idpos, len);

    if (id < 0)
      return E_FILE_FORMAT_INVALID;

    if (id == libwebm::kMkvCluster)
      break;

    pos += len;  // consume ID

    if ((pos + 1) > available)
      return (pos + 1);

    // Read Size
    result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return result;

    if (result > 0) {
      // MkvReader doesn't have enough data to satisfy this read attempt.
      return (pos + 1);
    }

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > available)
      return pos + len;

    const long long size = ReadUInt(m_pReader, pos, len);

    if (size < 0 || len < 1 || len > 8) {
      // TODO(tomfinegan): ReadUInt should return an error when len is < 1 or
      // len > 8 is true instead of checking this _everywhere_.
      return size;
    }

    pos += len;  // consume length of size of element

    // Avoid rolling over pos when very close to LLONG_MAX.
    rollover_check = static_cast<unsigned long long>(pos) + size;
    if (rollover_check > LLONG_MAX)
      return E_FILE_FORMAT_INVALID;

    const long long element_size = size + pos - element_start;

    // Pos now points to start of payload

    if ((segment_stop >= 0) && ((pos + size) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    // We read EBML elements either in total or nothing at all.

    if ((pos + size) > available)
      return pos + size;

    if (id == libwebm::kMkvInfo) {
      if (m_pInfo)
        return E_FILE_FORMAT_INVALID;

      m_pInfo = new (std::nothrow)
          SegmentInfo(this, pos, size, element_start, element_size);

      if (m_pInfo == NULL)
        return -1;

      const long status = m_pInfo->Parse();

      if (status)
        return status;
    } else if (id == libwebm::kMkvTracks) {
      if (m_pTracks)
        return E_FILE_FORMAT_INVALID;

      m_pTracks = new (std::nothrow)
          Tracks(this, pos, size, element_start, element_size);

      if (m_pTracks == NULL)
        return -1;

      const long status = m_pTracks->Parse();

      if (status)
        return status;
    } else if (id == libwebm::kMkvCues) {
      if (m_pCues == NULL) {
        m_pCues = new (std::nothrow)
            Cues(this, pos, size, element_start, element_size);

        if (m_pCues == NULL)
          return -1;
      }
    } else if (id == libwebm::kMkvSeekHead) {
      if (m_pSeekHead == NULL) {
        m_pSeekHead = new (std::nothrow)
            SeekHead(this, pos, size, element_start, element_size);

        if (m_pSeekHead == NULL)
          return -1;

        const long status = m_pSeekHead->Parse();

        if (status)
          return status;
      }
    } else if (id == libwebm::kMkvChapters) {
      if (m_pChapters == NULL) {
        m_pChapters = new (std::nothrow)
            Chapters(this, pos, size, element_start, element_size);

        if (m_pChapters == NULL)
          return -1;

        const long status = m_pChapters->Parse();

        if (status)
          return status;
      }
    } else if (id == libwebm::kMkvTags) {
      if (m_pTags == NULL) {
        m_pTags = new (std::nothrow)
            Tags(this, pos, size, element_start, element_size);

        if (m_pTags == NULL)
          return -1;

        const long status = m_pTags->Parse();

        if (status)
          return status;
      }
    }

    m_pos = pos + size;  // consume payload
  }

  if (segment_stop >= 0 && m_pos > segment_stop)
    return E_FILE_FORMAT_INVALID;

  if (m_pInfo == NULL)  // TODO: liberalize this behavior
    return E_FILE_FORMAT_INVALID;

  if (m_pTracks == NULL)
    return E_FILE_FORMAT_INVALID;

  return 0;  // success
}